

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::egl::DisplayFactory::DisplayFactory(DisplayFactory *this,EventState *eventState)

{
  NativeWindowFactory *factory;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EventState *local_18;
  EventState *eventState_local;
  DisplayFactory *this_local;
  
  local_18 = eventState;
  eventState_local = (EventState *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"x11",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Native X11 Display",&local_71);
  eglu::NativeDisplayFactory::NativeDisplayFactory
            (&this->super_NativeDisplayFactory,&local_38,&local_70,
             CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY,0x31d6,
             "EGL_EXT_platform_x11");
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_NativeDisplayFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__DisplayFactory_0158e588;
  this->m_eventState = local_18;
  factory = (NativeWindowFactory *)operator_new(0x50);
  WindowFactory::WindowFactory((WindowFactory *)factory);
  FactoryRegistry<eglu::NativeWindowFactory>::registerFactory
            (&(this->super_NativeDisplayFactory).m_nativeWindowRegistry,factory);
  return;
}

Assistant:

DisplayFactory::DisplayFactory (EventState& eventState)
	: NativeDisplayFactory	("x11", "Native X11 Display",
							 Display::CAPABILITIES,
							 EGL_PLATFORM_X11_SCREEN_EXT,
							 "EGL_EXT_platform_x11")
	, m_eventState			(eventState)
{
	m_nativeWindowRegistry.registerFactory(new WindowFactory());
	// m_nativePixmapRegistry.registerFactory(new PixmapFactory());
}